

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O1

Clause * __thiscall
Saturation::PredicateSplitPassiveClauseContainer::popSelected
          (PredicateSplitPassiveClauseContainer *this)

{
  int *piVar1;
  PassiveClauseContainer *pPVar2;
  uint *puVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  iterator __begin2;
  Clause *pCVar7;
  pointer puVar8;
  uint *puVar9;
  iterator __end2;
  uint uVar10;
  uint *puVar11;
  HandlerList *pHVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  uniform_int_distribution<int> local_30;
  
  if (this->_randomize == true) {
    local_30._M_param._M_b = this->_ratioSum - 1;
    local_30._M_param._M_a = 0;
    uVar6 = std::uniform_int_distribution<int>::operator()
                      (&local_30,&::Lib::Random::_eng,&local_30._M_param);
    puVar11 = (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar10 = *puVar11;
    uVar16 = 0;
    if (uVar10 <= uVar6) {
      uVar16 = 0;
      do {
        uVar6 = uVar6 - uVar10;
        uVar16 = (ulong)((int)uVar16 + 1);
        uVar10 = puVar11[uVar16];
      } while (uVar10 <= uVar6);
    }
  }
  else {
    puVar9 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar11 = puVar9 + 1;
    puVar13 = puVar9;
    puVar14 = puVar9;
    if (puVar11 != puVar3 && puVar9 != puVar3) {
      do {
        puVar13 = puVar11;
        if (*puVar14 <= *puVar11) {
          puVar13 = puVar14;
        }
        puVar11 = puVar11 + 1;
        puVar14 = puVar13;
      } while (puVar11 != puVar3);
    }
    uVar10 = *puVar13;
    uVar16 = (ulong)((long)puVar13 - (long)puVar9) >> 2;
    uVar15 = (long)puVar13 - (long)puVar9 & 0x3fffffffc;
    piVar1 = (int *)((long)puVar9 + uVar15);
    *piVar1 = *piVar1 + *(int *)((long)(this->_invertedRatios).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar15);
    for (; puVar9 != puVar3; puVar9 = puVar9 + 1) {
      *puVar9 = *puVar9 - uVar10;
    }
  }
  puVar8 = (this->_queues).
           super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar15 = uVar16 & 0xffffffff;
  if ((long)(uVar16 & 0xffffffff) <
      (long)(this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3) {
    do {
      cVar5 = (**(code **)(*(long *)puVar8[uVar15]._M_t.
                                    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    ._M_t + 0x28))();
      if (cVar5 == '\0') break;
      uVar15 = (ulong)((int)uVar15 + 1);
      puVar8 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar15 <
             (long)(this->_queues).
                   super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3);
  }
  if ((long)(this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar15) {
    uVar15 = uVar16 & 0xffffffff;
    do {
      uVar15 = (ulong)((int)uVar15 - 1);
      cVar5 = (**(code **)(*(long *)(this->_queues).
                                    super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                                    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    ._M_t + 0x28))();
    } while (cVar5 != '\0');
  }
  pCVar7 = (Clause *)
           (**(code **)(*(long *)(this->_queues).
                                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_t.
                                 super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                 ._M_t + 0x30))();
  if ((this->_layeredArrangement == true) &&
     (puVar8 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->_queues).
     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != puVar8)) {
    uVar15 = 0;
    uVar16 = 1;
    do {
      pPVar2 = puVar8[uVar15]._M_t.
               super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ._M_t.
               super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
               .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
      (**(code **)(*(long *)&(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer +
                  0x20))(pPVar2,pCVar7);
      puVar8 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar16 < (ulong)((long)(this->_queues).
                                     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3)
      ;
      uVar15 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar4);
  }
  for (pHVar12 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                 super_ClauseContainer.selectedEvent.super_BaseEvent._handlers;
      pHVar12 != (HandlerList *)0x0; pHVar12 = pHVar12->_tail) {
    (*pHVar12->_head->_vptr_HandlerStruct[2])(pHVar12->_head,pCVar7);
  }
  return pCVar7;
}

Assistant:

Clause* PredicateSplitPassiveClauseContainer::popSelected()
{
  unsigned queueIndex;

  if (_randomize) {
    unsigned toss = Random::getInteger(_ratioSum);
    // cout << "metaqueue " << _name << " toss " << toss << " (below: " << _ratioSum << ")";
    queueIndex = 0;
    while (toss >= _ratios[queueIndex]) {
      toss -= _ratios[queueIndex];
      queueIndex++;
    }
    // cout << " means " << queueIndex << " (below: " << _ratios.size() << ")" << endl;
  } else {
    // compute queue from which we will pick a clause:
    // choose queue using weighted round robin
    auto minElementIt = std::min_element(_balances.begin(), _balances.end());
    auto minElement = *minElementIt; // need to save the value of the min element before updating it to a new value, since it may not remain the minimal element after the update

    queueIndex = std::distance(_balances.begin(), minElementIt);

    _balances[queueIndex] += _invertedRatios[queueIndex];
    for (auto& balance : _balances)
    {
      balance -= minElement;
    }
  }

  // if chosen queue is empty, use the next queue to the right
  // this succeeds in a multi-split-queue-non-LRS-setting where we have the invariant that each clause from queue i is contained in queue j if i<j
  auto currIndex = queueIndex;
  while (currIndex < (long int)_queues.size() && _queues[currIndex]->isEmpty())
  {
    currIndex++;
  }
  // for tammet-style-queues or in the presence of LRS, we need to also consider the queues to the left as additional fallback (using the invar: at least one queue has at least one clause if popSelected is called)
  if (currIndex == (long int)_queues.size())
  {
    // fallback: try remaining queues, at least one of them must be nonempty
    ASS(queueIndex > 0); // otherwise we would already have searched through all queues
    currIndex = queueIndex - 1;
    while (_queues[currIndex]->isEmpty())
    {
      currIndex--;
      ASS(currIndex >= 0);
    }
  }
  ASS(!_queues[currIndex]->isEmpty());

  // pop clause from selected queue
  auto cl = _queues[currIndex]->popSelected();
  ASS(cl->store() == Clause::PASSIVE);

  // note: for a non-layered arrangement, the clause only occured in _queues[currIndex] (from which it was just removed using popSelected(), so we don't need any additional clause-removal
  if (_layeredArrangement)
  {
    // remove clause from all queues
    for (unsigned i = 0; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }

  selectedEvent.fire(cl);

  return cl;
}